

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O3

bool loadTerrainProgram(GLuint *glp,char *flag,GLuint uniformOffset)

{
  bool bVar1;
  int iVar2;
  GLint GVar3;
  GLenum GVar4;
  djg_program *program;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  char buf [1024];
  char acStack_438 [4];
  char acStack_434 [4];
  char acStack_430 [1024];
  
  program = (djg_program *)calloc(1,0x10);
  fwrite("Loading {Terrain-Program}\n",0x1a,1,_stdout);
  fflush(_stdout);
  if (g_terrain.flags.freeze == false) {
    djgp_push_string(program,flag);
  }
  if (g_terrain.method == 3) {
    djgp_push_string(program,
                     "#ifndef FRAGMENT_SHADER\n#extension GL_NV_mesh_shader : require\n#endif\n");
    djgp_push_string(program,"#extension GL_NV_shader_thread_group : require\n");
    djgp_push_string(program,"#extension GL_NV_shader_thread_shuffle : require\n");
    djgp_push_string(program,"#extension GL_NV_gpu_shader5 : require\n");
  }
  if ((ulong)(uint)g_camera.projection < 3) {
    djgp_push_string(program,&DAT_001b1198 +
                             *(int *)(&DAT_001b1198 + (ulong)(uint)g_camera.projection * 4));
  }
  djgp_push_string(program,"#define BUFFER_BINDING_TERRAIN_VARIABLES %i\n",0);
  djgp_push_string(program,"#define BUFFER_BINDING_MESHLET_VERTICES %i\n",3);
  djgp_push_string(program,"#define BUFFER_BINDING_MESHLET_INDEXES %i\n",4);
  djgp_push_string(program,"#define TERRAIN_PATCH_SUBD_LEVEL %i\n",(ulong)(uint)g_terrain.gpuSubd);
  djgp_push_string(program,"#define TERRAIN_PATCH_TESS_FACTOR %i\n",
                   (ulong)(uint)(1 << ((byte)g_terrain.gpuSubd & 0x1f)));
  djgp_push_string(program,"#define LEB_BUFFER_COUNT 1\n");
  djgp_push_string(program,"#define BUFFER_BINDING_LEB %i\n",0);
  if ((ulong)(uint)g_terrain.shading < 4) {
    djgp_push_string(program,&DAT_001b11a4 +
                             *(int *)(&DAT_001b11a4 + (ulong)(uint)g_terrain.shading * 4));
  }
  if (g_terrain.flags.displace == true) {
    djgp_push_string(program,"#define FLAG_DISPLACE 1\n");
  }
  if (g_terrain.flags.cull == true) {
    djgp_push_string(program,"#define FLAG_CULL 1\n");
  }
  if (g_terrain.flags.wire == true) {
    djgp_push_string(program,"#define FLAG_WIRE 1\n");
  }
  strcpy(acStack_438,g_app.dir.shader);
  sVar5 = strlen(acStack_438);
  builtin_strncpy(acStack_438 + sVar5,"FrustumC",8);
  builtin_strncpy(acStack_430 + sVar5,"ulling.glsl",0xc);
  djgp_push_file(program,acStack_438);
  djgp_push_file(program,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/GLSL/LongestEdgeBisection.glsl"
                );
  strcpy(acStack_438,g_app.dir.shader);
  sVar5 = strlen(acStack_438);
  builtin_strncpy(acStack_438 + sVar5,"TerrainR",8);
  builtin_strncpy(acStack_430 + sVar5,"enderCommon.glsl",0x11);
  djgp_push_file(program,acStack_438);
  bVar1 = g_terrain.flags.wire;
  switch(g_terrain.method) {
  case 0:
    djgp_push_string(program,"#define BUFFER_BINDING_LEB_NODE_COUNTER %i\n",6);
    djgp_push_string(program,"#define BUFFER_BINDING_LEB_NODE_BUFFER %i\n",5);
    iVar2 = strcmp("/* thisIsAHackForComputePass */\n",flag);
    bVar1 = g_terrain.flags.wire;
    if (iVar2 != 0) {
      strcpy(acStack_438,g_app.dir.shader);
      sVar5 = strlen(acStack_438);
      builtin_strncpy(acStack_430 + sVar5 + 5,"CS.glsl",8);
      uVar10._0_1_ = 'a';
      uVar10._1_1_ = 'i';
      uVar10._2_1_ = 'n';
      uVar10._3_1_ = 'U';
      uVar11._0_1_ = 'p';
      uVar11._1_1_ = 'd';
      uVar11._2_1_ = 'a';
      uVar11._3_1_ = 't';
      uVar12._0_1_ = 'e';
      uVar12._1_1_ = 'C';
      uVar12._2_1_ = 'S';
      uVar12._3_1_ = '.';
      goto LAB_0016bdf7;
    }
    strcpy(acStack_438,g_app.dir.shader);
    sVar5 = strlen(acStack_438);
    pcVar6 = acStack_438 + sVar5;
    if (bVar1 != true) {
      builtin_strncpy(acStack_438 + sVar5,"TerrainR",8);
      builtin_strncpy(acStack_430 + sVar5,"enderCS.",8);
      uVar7 = 0x6c736c672e5343;
      goto LAB_0016be68;
    }
    builtin_strncpy(acStack_430 + sVar5 + 2,"derCS_Wire.glsl",0x10);
    uVar13._0_1_ = 'r';
    uVar13._1_1_ = 'C';
    uVar13._2_1_ = 'S';
    uVar13._3_1_ = '_';
LAB_0016be4f:
    pcVar6[0] = 'T';
    pcVar6[1] = 'e';
    pcVar6[2] = 'r';
    pcVar6[3] = 'r';
    pcVar6[4] = 'a';
    pcVar6[5] = 'i';
    pcVar6[6] = 'n';
    pcVar6[7] = 'R';
    pcVar6[8] = 'e';
    pcVar6[9] = 'n';
    pcVar6[10] = 'd';
    pcVar6[0xb] = 'e';
    *(undefined4 *)(pcVar6 + 0xc) = uVar13;
    break;
  case 1:
    strcpy(acStack_438,g_app.dir.shader);
    sVar5 = strlen(acStack_438);
    pcVar6 = acStack_438 + sVar5;
    if (bVar1 == true) {
      builtin_strncpy(acStack_430 + sVar5 + 2,"derTS_Wire.glsl",0x10);
      uVar13._0_1_ = 'r';
      uVar13._1_1_ = 'T';
      uVar13._2_1_ = 'S';
      uVar13._3_1_ = '_';
      goto LAB_0016be4f;
    }
    builtin_strncpy(acStack_438 + sVar5,"TerrainR",8);
    builtin_strncpy(acStack_430 + sVar5,"enderTS.",8);
    uVar7 = 0x6c736c672e5354;
LAB_0016be68:
    *(undefined8 *)(pcVar6 + 0xd) = uVar7;
    break;
  case 2:
    if (g_terrain.flags.wire != true) {
      uVar8 = 3;
      if (g_terrain.gpuSubd != 0) {
        uVar8 = (ulong)(uint)(4 << ((char)g_terrain.gpuSubd * '\x02' - 1U & 0x1f));
      }
      djgp_push_string(program,"#define MAX_VERTICES %i\n",uVar8);
      strcpy(acStack_438,g_app.dir.shader);
      sVar5 = strlen(acStack_438);
      builtin_strncpy(acStack_430 + sVar5 + 5,"GS.glsl",8);
      uVar10._0_1_ = 'a';
      uVar10._1_1_ = 'i';
      uVar10._2_1_ = 'n';
      uVar10._3_1_ = 'R';
      uVar11._0_1_ = 'e';
      uVar11._1_1_ = 'n';
      uVar11._2_1_ = 'd';
      uVar11._3_1_ = 'e';
      uVar12._0_1_ = 'r';
      uVar12._1_1_ = 'G';
      uVar12._2_1_ = 'S';
      uVar12._3_1_ = '.';
      goto LAB_0016bdf7;
    }
    djgp_push_string(program,"#define MAX_VERTICES %i\n",
                     (ulong)(uint)(3 << ((char)g_terrain.gpuSubd * '\x02' & 0x1fU)));
    strcpy(acStack_438,g_app.dir.shader);
    sVar5 = strlen(acStack_438);
    builtin_strncpy(acStack_438 + sVar5,"TerrainR",8);
    builtin_strncpy(acStack_430 + sVar5,"enderGS_Wire.glsl",0x12);
    break;
  case 3:
    strcpy(acStack_438,g_app.dir.shader);
    sVar5 = strlen(acStack_438);
    builtin_strncpy(acStack_430 + sVar5 + 5,"MS.glsl",8);
    uVar10._0_1_ = 'a';
    uVar10._1_1_ = 'i';
    uVar10._2_1_ = 'n';
    uVar10._3_1_ = 'R';
    uVar11._0_1_ = 'e';
    uVar11._1_1_ = 'n';
    uVar11._2_1_ = 'd';
    uVar11._3_1_ = 'e';
    uVar12._0_1_ = 'r';
    uVar12._1_1_ = 'M';
    uVar12._2_1_ = 'S';
    uVar12._3_1_ = '.';
LAB_0016bdf7:
    builtin_strncpy(acStack_438 + sVar5,"Terr",4);
    *(undefined4 *)(acStack_434 + sVar5) = uVar10;
    *(undefined4 *)(acStack_430 + sVar5) = uVar11;
    *(undefined4 *)(acStack_430 + sVar5 + 4) = uVar12;
    break;
  default:
    goto switchD_0016bc4b_default;
  }
  djgp_push_file(program,acStack_438);
switchD_0016bc4b_default:
  bVar9 = false;
  bVar1 = djgp_to_gl(program,0x1c2,false,true,glp);
  djgp_release(program);
  if (bVar1) {
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_DmapFactor");
    g_gl.uniforms[uniformOffset + 4] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_LodFactor");
    g_gl.uniforms[uniformOffset + 6] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_DmapSampler");
    g_gl.uniforms[uniformOffset + 2] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_SmapSampler");
    g_gl.uniforms[uniformOffset + 3] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_TargetEdgeLength");
    g_gl.uniforms[uniformOffset + 5] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_MinLodVariance");
    g_gl.uniforms[uniformOffset + 7] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_ScreenResolution");
    g_gl.uniforms[uniformOffset + 8] = GVar3;
    configureTerrainProgram(*glp,uniformOffset);
    GVar4 = (*glad_glGetError)();
    bVar9 = GVar4 == 0;
  }
  return bVar9;
}

Assistant:

bool loadTerrainProgram(GLuint *glp, const char *flag, GLuint uniformOffset)
{
    djg_program *djp = djgp_create();
    char buf[1024];

    LOG("Loading {Terrain-Program}\n");
    if (!g_terrain.flags.freeze)
        djgp_push_string(djp, flag);
    if (g_terrain.method == METHOD_MS) {
        djgp_push_string(djp, "#ifndef FRAGMENT_SHADER\n#extension GL_NV_mesh_shader : require\n#endif\n");
        djgp_push_string(djp, "#extension GL_NV_shader_thread_group : require\n");
        djgp_push_string(djp, "#extension GL_NV_shader_thread_shuffle : require\n");
        djgp_push_string(djp, "#extension GL_NV_gpu_shader5 : require\n");
    }
    switch (g_camera.projection) {
    case PROJECTION_RECTILINEAR:
        djgp_push_string(djp, "#define PROJECTION_RECTILINEAR\n");
        break;
    case PROJECTION_FISHEYE:
        djgp_push_string(djp, "#define PROJECTION_FISHEYE\n");
        break;
    case PROJECTION_ORTHOGRAPHIC:
        djgp_push_string(djp, "#define PROJECTION_ORTHOGRAPHIC\n");
        break;
    default:
        break;
    }
    djgp_push_string(djp, "#define BUFFER_BINDING_TERRAIN_VARIABLES %i\n", STREAM_TERRAIN_VARIABLES);
    djgp_push_string(djp, "#define BUFFER_BINDING_MESHLET_VERTICES %i\n", BUFFER_MESHLET_VERTICES);
    djgp_push_string(djp, "#define BUFFER_BINDING_MESHLET_INDEXES %i\n", BUFFER_MESHLET_INDEXES);
    djgp_push_string(djp, "#define TERRAIN_PATCH_SUBD_LEVEL %i\n", g_terrain.gpuSubd);
    djgp_push_string(djp, "#define TERRAIN_PATCH_TESS_FACTOR %i\n", 1 << g_terrain.gpuSubd);
    djgp_push_string(djp, "#define LEB_BUFFER_COUNT 1\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_LEB %i\n", BUFFER_LEB);
    if (g_terrain.shading == SHADING_DIFFUSE)
        djgp_push_string(djp, "#define SHADING_DIFFUSE 1\n");
    else if (g_terrain.shading == SHADING_NORMALS)
        djgp_push_string(djp, "#define SHADING_NORMALS 1\n");
    else if (g_terrain.shading == SHADING_SNOWY)
        djgp_push_string(djp, "#define SHADING_SNOWY 1\n");
    else if (g_terrain.shading == SHADING_COLOR)
        djgp_push_string(djp, "#define SHADING_COLOR 1\n");
    if (g_terrain.flags.displace)
        djgp_push_string(djp, "#define FLAG_DISPLACE 1\n");
    if (g_terrain.flags.cull)
        djgp_push_string(djp, "#define FLAG_CULL 1\n");
    if (g_terrain.flags.wire)
        djgp_push_string(djp, "#define FLAG_WIRE 1\n");
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "FrustumCulling.glsl"));
    djgp_push_file(djp, PATH_TO_LEB_GLSL_LIBRARY "LongestEdgeBisection.glsl");
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderCommon.glsl"));
    if (g_terrain.method == METHOD_CS) {
        djgp_push_string(djp, "#define BUFFER_BINDING_LEB_NODE_COUNTER %i\n", BUFFER_LEB_NODE_COUNTER);
        djgp_push_string(djp, "#define BUFFER_BINDING_LEB_NODE_BUFFER %i\n", BUFFER_LEB_NODE_BUFFER);

        if (strcmp("/* thisIsAHackForComputePass */\n", flag) == 0) {
            if (g_terrain.flags.wire) {
                djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderCS_Wire.glsl"));
            } else {
                djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderCS.glsl"));
            }
        } else {
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainUpdateCS.glsl"));
        }
    } else if (g_terrain.method == METHOD_TS) {
        if (g_terrain.flags.wire) {
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderTS_Wire.glsl"));
        } else {
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderTS.glsl"));
        }
    } else if (g_terrain.method == METHOD_GS) {
        int subdLevel = g_terrain.gpuSubd;

        if (g_terrain.flags.wire) {
            int vertexCnt = 3 << (2 * subdLevel);

            djgp_push_string(djp, "#define MAX_VERTICES %i\n", vertexCnt);
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderGS_Wire.glsl"));
        } else {
            int vertexCnt = subdLevel == 0 ? 3 : 4 << (2 * subdLevel - 1);

            djgp_push_string(djp, "#define MAX_VERTICES %i\n", vertexCnt);
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderGS.glsl"));
        }
    } else if (g_terrain.method == METHOD_MS) {
        djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderMS.glsl"));
    }

    if (!djgp_to_gl(djp, 450, false, true, glp)) {
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_TERRAIN_DMAP_FACTOR + uniformOffset] =
        glGetUniformLocation(*glp, "u_DmapFactor");
    g_gl.uniforms[UNIFORM_TERRAIN_LOD_FACTOR + uniformOffset] =
        glGetUniformLocation(*glp, "u_LodFactor");
    g_gl.uniforms[UNIFORM_TERRAIN_DMAP_SAMPLER + uniformOffset] =
        glGetUniformLocation(*glp, "u_DmapSampler");
    g_gl.uniforms[UNIFORM_TERRAIN_SMAP_SAMPLER + uniformOffset] =
        glGetUniformLocation(*glp, "u_SmapSampler");
    g_gl.uniforms[UNIFORM_TERRAIN_TARGET_EDGE_LENGTH + uniformOffset] =
        glGetUniformLocation(*glp, "u_TargetEdgeLength");
    g_gl.uniforms[UNIFORM_TERRAIN_MIN_LOD_VARIANCE + uniformOffset] =
        glGetUniformLocation(*glp, "u_MinLodVariance");
    g_gl.uniforms[UNIFORM_TERRAIN_SCREEN_RESOLUTION + uniformOffset] =
        glGetUniformLocation(*glp, "u_ScreenResolution");

    configureTerrainProgram(*glp, uniformOffset);

    return (glGetError() == GL_NO_ERROR);
}